

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.h
# Opt level: O2

Sexp * NativeFunctionHelper<Sexp*,Sexp*,Sexp*,0ul,1ul>
                 (function<Sexp_*(Sexp_*,_Sexp_*)> *wrapped,undefined8 *args)

{
  Sexp *pSVar1;
  
  pSVar1 = std::function<Sexp_*(Sexp_*,_Sexp_*)>::operator()(wrapped,(Sexp *)*args,(Sexp *)args[1]);
  return pSVar1;
}

Assistant:

Ret NativeFunctionHelper(std::function<Ret(Args...)> wrapped, Sexp **args,
                         std::index_sequence<Index...>) {
// both GCC and MSVC are silly and don't think that args is being used here,
// despite it obviously being used by the parameter pack below.
#if defined(__GNUG__) || defined(_MSC_VER)
  UNUSED_PARAMETER(args);
#endif
  return wrapped(args[Index]...);
}